

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O2

void google::protobuf::internal::LogIndexOutOfBounds(int index,int size)

{
  LogMessage *pLVar1;
  LogMessage LStack_28;
  
  absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
            ((LogMessageDebugFatal *)&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.cc"
             ,0x21);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&LStack_28,(char (*) [7])"Index ");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,index);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [16])" out of bounds ");
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,size);
  absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
            ((LogMessageDebugFatal *)&LStack_28);
  return;
}

Assistant:

void LogIndexOutOfBounds(int index, int size) {
  ABSL_DLOG(FATAL) << "Index " << index << " out of bounds " << size;
}